

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O2

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,OperationSamplingStrategy *strategy)

{
  const_reference this;
  allocator local_51;
  key_type local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_50,"operation",&local_51);
  this = nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::at(json,&local_50);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_30,this);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_operation
            ((string *)strategy);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_30,"probabilisticSampling",&local_51);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::at(json,&local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)&local_50);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)strategy);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
  ~ProbabilisticSamplingStrategy((ProbabilisticSamplingStrategy *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      OperationSamplingStrategy& strategy)
{
    FIELD_FROM_JSON(strategy, operation);
    FIELD_FROM_JSON(strategy, probabilisticSampling);
}